

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_resize_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_22b6284::AV1ResizeXTest_DISABLED_SpeedTest_Test::TestBody
          (AV1ResizeXTest_DISABLED_SpeedTest_Test *this)

{
  uint32_t uVar1;
  long lVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int width2;
  long lVar8;
  long lVar9;
  long lVar10;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  timeval local_70;
  timeval local_60;
  timeval local_50;
  timeval local_40;
  
  if (0 < (this->super_AV1ResizeXTest).height_ * (this->super_AV1ResizeXTest).width_) {
    lVar10 = 0;
    do {
      uVar1 = testing::internal::Random::Generate
                        (&(this->super_AV1ResizeXTest).rng_.random_,0x80000000);
      (this->super_AV1ResizeXTest).src_._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[lVar10] = (uchar)(uVar1 >> 0x17);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)(this->super_AV1ResizeXTest).height_ *
                      (long)(this->super_AV1ResizeXTest).width_);
  }
  if (1 < (this->super_AV1ResizeXTest).n_levels_) {
    iVar7 = 1;
    do {
      width2 = (this->super_AV1ResizeXTest).width_ >> ((byte)iVar7 & 0x1f);
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      iVar6 = 1000;
      do {
        av1_resize_horz_dir_c
                  ((this->super_AV1ResizeXTest).src_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                   (this->super_AV1ResizeXTest).width_,
                   (this->super_AV1ResizeXTest).ref_dest_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                   (this->super_AV1ResizeXTest).height_,width2 * 2,width2);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      lVar10 = local_40.tv_sec - local_50.tv_sec;
      lVar9 = local_40.tv_usec - local_50.tv_usec;
      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
      iVar6 = 1000;
      do {
        (*(this->super_AV1ResizeXTest).test_fun_)
                  ((this->super_AV1ResizeXTest).src_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                   (this->super_AV1ResizeXTest).width_,
                   (this->super_AV1ResizeXTest).test_dest_._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                   (this->super_AV1ResizeXTest).height_,width2 * 2,width2);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      lVar8 = lVar9 + 1000000;
      if (-1 < lVar9) {
        lVar8 = lVar9;
      }
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      lVar2 = local_60.tv_sec - local_70.tv_sec;
      lVar4 = local_60.tv_usec - local_70.tv_usec;
      lVar5 = lVar4 + 1000000;
      if (-1 < lVar4) {
        lVar5 = lVar4;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"level: ",7);
      poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," [",2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,width2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," x ",3);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->super_AV1ResizeXTest).height_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"] C time = ",0xb);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," , SIMD time = ",0xf);
      poVar3 = std::ostream::_M_insert<long>((long)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," scaling=",9);
      poVar3 = std::ostream::_M_insert<double>
                         ((double)((float)(lVar8 + ((lVar9 >> 0x3f) + lVar10) * 1000000) /
                                  (float)(((lVar4 >> 0x3f) + lVar2) * 1000000 + lVar5)));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"x \n",3);
      iVar7 = iVar7 + 1;
    } while (iVar7 < (this->super_AV1ResizeXTest).n_levels_);
  }
  return;
}

Assistant:

TEST_P(AV1ResizeXTest, DISABLED_SpeedTest) { SpeedTest(); }